

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

bool Js::DateImplementation::TryParseMilliseconds
               (char16 *str,size_t length,size_t startIndex,int *value,size_t *foundDigits)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c1,"(str)","str");
    if (!bVar3) goto LAB_00b3d915;
    *puVar4 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c2,"(length)","length");
    if (!bVar3) goto LAB_00b3d915;
    *puVar4 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c3,"(startIndex <= length)","startIndex <= length");
    if (!bVar3) {
LAB_00b3d915:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar9 = length - startIndex;
  if (uVar9 != 0) {
    uVar5 = 0;
    while (str[startIndex + uVar5] == L'0') {
      uVar5 = uVar5 + 1;
      if (uVar9 == uVar5) {
        iVar7 = 0;
        bVar3 = false;
        uVar5 = uVar9;
LAB_00b3d8ce:
        *foundDigits = uVar5;
        if (uVar5 == 2) {
          iVar7 = iVar7 * 10;
        }
        else if (uVar5 == 1) {
          iVar7 = iVar7 * 100;
        }
        *value = iVar7;
        bVar10 = true;
        if (bVar3) {
          bVar10 = (ushort)(str[uVar5 + startIndex] + L'ￆ') < 0xfff6;
        }
        return bVar10;
      }
    }
    bVar3 = false;
    iVar7 = 0;
    uVar6 = uVar5;
    if (uVar5 < uVar9) {
      do {
        uVar8 = str[startIndex + uVar6] + L'￐';
        iVar2 = (uint)uVar8 + iVar7 * 10;
        if (9 < uVar8) {
          iVar2 = iVar7;
        }
        if (2 < uVar6) {
          iVar2 = iVar7;
        }
        iVar7 = iVar2;
        uVar5 = uVar6;
      } while ((uVar8 < 10) && (uVar6 = uVar6 + 1, uVar5 = uVar9, uVar6 < uVar9));
      bVar3 = 9 < uVar8;
    }
    if (uVar5 != 0) goto LAB_00b3d8ce;
  }
  return false;
}

Assistant:

bool DateImplementation::TryParseMilliseconds(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        size_t &foundDigits)
    {
        const size_t minNumDigits = 1;

        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        size_t allDigits = length - startIndex;
        if(allDigits < minNumDigits)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < allDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < allDigits ; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            if (i < 3) // not past the 3rd digit in the milliseconds, don't ignore
                v = v * 10 + d;
        }
        if(i < minNumDigits)
            return false;

        foundDigits = i;
        if (foundDigits == 1)
                v = v * 100;
        else if (foundDigits == 2)
                v = v * 10;

        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }